

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_migrate.cpp
# Opt level: O0

Dist * Omega_h::get_new_copies2old_owners
                 (Dist *__return_storage_ptr__,Dist *uses2old_owners,GOs *old_owner_globals)

{
  Read<long> local_170;
  undefined1 local_160 [8];
  LOs old_owners2items;
  undefined1 local_b0 [8];
  Dist old_owners2uniq_uses;
  GOs *old_owner_globals_local;
  Dist *uses2old_owners_local;
  Dist *uniq_uses2old_owners;
  
  old_owners2uniq_uses.comm_[1].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)old_owner_globals;
  Dist::Dist((Dist *)&stack0xfffffffffffffec0,uses2old_owners);
  get_old_owners2uniq_uses((Dist *)local_b0,(Dist *)&stack0xfffffffffffffec0);
  Dist::~Dist((Dist *)&stack0xfffffffffffffec0);
  Dist::roots2items((Dist *)local_160);
  Read<long>::Read(&local_170,(Read<int> *)old_owner_globals);
  Dist::set_dest_globals((Dist *)local_b0,&local_170);
  Read<long>::~Read(&local_170);
  Dist::invert(__return_storage_ptr__,(Dist *)local_b0);
  Read<int>::~Read((Read<int> *)local_160);
  Dist::~Dist((Dist *)local_b0);
  return __return_storage_ptr__;
}

Assistant:

Dist get_new_copies2old_owners(Dist uses2old_owners, GOs old_owner_globals) {
  auto old_owners2uniq_uses = get_old_owners2uniq_uses(uses2old_owners);
  auto old_owners2items = old_owners2uniq_uses.roots2items();
  old_owners2uniq_uses.set_dest_globals(old_owner_globals);
  auto uniq_uses2old_owners = old_owners2uniq_uses.invert();
  return uniq_uses2old_owners;
}